

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O2

void __thiscall
chrono::ChOptimizerGradient::ChOptimizerGradient
          (ChOptimizerGradient *this,ChOptimizerGradient *other)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  ChOptimizer::ChOptimizer(&this->super_ChOptimizer,&other->super_ChOptimizer);
  (this->super_ChOptimizer)._vptr_ChOptimizer = (_func_int **)&PTR__ChOptimizer_01186960;
  dVar1 = other->arg_tol;
  this->initial_step = other->initial_step;
  this->arg_tol = dVar1;
  this->fun_tol = other->fun_tol;
  iVar2 = other->maxgradients;
  iVar3 = other->maxdilationsteps;
  iVar4 = other->maxbisections;
  this->maxevaluations = other->maxevaluations;
  this->maxgradients = iVar2;
  this->maxdilationsteps = iVar3;
  this->maxbisections = iVar4;
  this->dilation = other->dilation;
  this->do_conjugate = other->do_conjugate;
  return;
}

Assistant:

ChOptimizerGradient::ChOptimizerGradient(const ChOptimizerGradient& other) : ChOptimizer(other) {
    initial_step = other.initial_step;
    arg_tol = other.arg_tol;
    fun_tol = other.fun_tol;
    maxevaluations = other.maxevaluations;
    maxgradients = other.maxgradients;
    maxdilationsteps = other.maxdilationsteps;
    maxbisections = other.maxbisections;
    dilation = other.dilation;
    do_conjugate = other.do_conjugate;
}